

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResumeThrow
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ResumeThrow *curr,
          optional<wasm::HeapType> ct)

{
  ulong uVar1;
  bool bVar2;
  HeapType *pHVar3;
  Tag *this_00;
  size_t sVar4;
  size_t sVar5;
  Expression **childp;
  Type *pTVar6;
  Type local_60;
  uintptr_t local_58;
  ulong local_50;
  size_t i;
  char *local_40;
  Type local_38;
  Type params;
  ResumeThrow *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::HeapType> ct_local;
  
  this_local = ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
  ct_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  bVar2 = std::optional<wasm::HeapType>::has_value((optional<wasm::HeapType> *)&this_local);
  if (!bVar2) {
    params.id = (uintptr_t)wasm::Type::getHeapType(&curr->cont->type);
    std::optional<wasm::HeapType>::operator=
              ((optional<wasm::HeapType> *)&this_local,(HeapType *)&params);
  }
  pHVar3 = std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&this_local);
  bVar2 = HeapType::isContinuation(pHVar3);
  if (!bVar2) {
    __assert_fail("ct->isContinuation()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x47c,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResumeThrow(ResumeThrow *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  i = (curr->tag).super_IString.str._M_len;
  local_40 = (curr->tag).super_IString.str._M_str;
  this_00 = Module::getTag(this->wasm,(Name)(curr->tag).super_IString.str);
  local_38 = wasm::Tag::params(this_00);
  sVar4 = wasm::Type::size(&local_38);
  sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(curr->operands).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  if (sVar4 == sVar5) {
    local_50 = 0;
    while( true ) {
      uVar1 = local_50;
      sVar4 = wasm::Type::size(&local_38);
      if (sVar4 <= uVar1) break;
      childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                         (&(curr->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          ,local_50);
      pTVar6 = wasm::Type::operator[](&local_38,local_50);
      local_58 = pTVar6->id;
      note(this,childp,(Type)local_58);
      local_50 = local_50 + 1;
    }
    pHVar3 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&this_local);
    wasm::Type::Type(&local_60,(HeapType)pHVar3->id,Nullable,Inexact);
    note(this,&curr->cont,local_60);
    return;
  }
  __assert_fail("params.size() == curr->operands.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x47e,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResumeThrow(ResumeThrow *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitResumeThrow(ResumeThrow* curr,
                        std::optional<HeapType> ct = std::nullopt) {
    if (!ct.has_value()) {
      ct = curr->cont->type.getHeapType();
    }
    assert(ct->isContinuation());
    auto params = wasm.getTag(curr->tag)->params();
    assert(params.size() == curr->operands.size());
    for (size_t i = 0; i < params.size(); ++i) {
      note(&curr->operands[i], params[i]);
    }
    note(&curr->cont, Type(*ct, Nullable));
  }